

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_div_2(mp_int *a,mp_int *b)

{
  int iVar1;
  ulong uVar2;
  ulong *puVar3;
  mp_int *in_RSI;
  int *in_RDI;
  mp_digit *tmpb;
  mp_digit *tmpa;
  mp_digit rr;
  mp_digit r;
  int oldused;
  int res;
  int x;
  ulong *local_48;
  undefined8 in_stack_ffffffffffffffc0;
  mp_int *in_stack_ffffffffffffffc8;
  ulong local_30;
  int local_1c;
  int local_4;
  
  if ((*in_RDI <= in_RSI->alloc) ||
     (local_4 = mp_grow(in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20)),
     local_4 == 0)) {
    iVar1 = in_RSI->used;
    in_RSI->used = *in_RDI;
    puVar3 = (ulong *)(*(long *)(in_RDI + 4) + (long)in_RSI->used * 8);
    local_48 = in_RSI->dp + in_RSI->used;
    local_30 = 0;
    local_1c = in_RSI->used;
    while( true ) {
      local_1c = local_1c + -1;
      puVar3 = puVar3 + -1;
      local_48 = local_48 + -1;
      if (local_1c < 0) break;
      uVar2 = *puVar3;
      *local_48 = *puVar3 >> 1 | local_30 << 0x3b;
      local_30 = uVar2 & 1;
    }
    local_48 = in_RSI->dp + in_RSI->used;
    for (local_1c = in_RSI->used; local_1c < iVar1; local_1c = local_1c + 1) {
      *local_48 = 0;
      local_48 = local_48 + 1;
    }
    in_RSI->sign = in_RDI[2];
    mp_clamp(in_RSI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mp_div_2(mp_int * a, mp_int * b)
{
  int     x, res, oldused;

  /* copy */
  if (b->alloc < a->used) {
    if ((res = mp_grow (b, a->used)) != MP_OKAY) {
      return res;
    }
  }

  oldused = b->used;
  b->used = a->used;
  {
    register mp_digit r, rr, *tmpa, *tmpb;

    /* source alias */
    tmpa = a->dp + b->used - 1;

    /* dest alias */
    tmpb = b->dp + b->used - 1;

    /* carry */
    r = 0;
    for (x = b->used - 1; x >= 0; x--) {
      /* get the carry for the next iteration */
      rr = *tmpa & 1;

      /* shift the current digit, add in carry and store */
      *tmpb-- = (*tmpa-- >> 1) | (r << (DIGIT_BIT - 1));

      /* forward carry to next iteration */
      r = rr;
    }

    /* zero excess digits */
    tmpb = b->dp + b->used;
    for (x = b->used; x < oldused; x++) {
      *tmpb++ = 0;
    }
  }
  b->sign = a->sign;
  mp_clamp (b);
  return MP_OKAY;
}